

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<std::optional<solitaire::cards::Card>_>::Print
               (Optional<solitaire::cards::Card> *value,ostream *os)

{
  bool bVar1;
  Card *value_00;
  ostream *os_local;
  Optional<solitaire::cards::Card> *value_local;
  
  std::operator<<(os,'(');
  bVar1 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar1) {
    value_00 = std::optional<solitaire::cards::Card>::operator*(value);
    UniversalPrint<solitaire::cards::Card>(value_00,os);
  }
  else {
    std::operator<<(os,"nullopt");
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }